

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCore.c
# Opt level: O2

Aig_Man_t * Dch_ComputeChoices(Aig_Man_t *pAig,Dch_Pars_t *pPars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined8 in_RAX;
  abctime aVar8;
  Dch_Man_t *p;
  abctime aVar9;
  Dch_Cla_t *pDVar10;
  abctime aVar11;
  Aig_Man_t *pAig_00;
  char *format;
  Aig_Man_t *pAVar12;
  undefined4 uVar13;
  
  uVar13 = (undefined4)((ulong)in_RAX >> 0x20);
  aVar8 = Abc_Clock();
  Aig_ManRandom(1);
  p = Dch_ManCreate(pAig,pPars);
  aVar9 = Abc_Clock();
  pDVar10 = Dch_CreateCandEquivClasses(pAig,pPars->nWords,pPars->fVerbose);
  p->ppClasses = pDVar10;
  aVar11 = Abc_Clock();
  p->timeSimInit = aVar11 - aVar9;
  iVar4 = Dch_ClassesLitNum(p->ppClasses);
  p->nLits = iVar4;
  Dch_ManSweep(p);
  aVar9 = Abc_Clock();
  p->timeTotal = aVar9 - aVar8;
  Dch_ManStop(p);
  if (pAig->pTable != (Aig_Obj_t **)0x0) {
    free(pAig->pTable);
    pAig->pTable = (Aig_Obj_t **)0x0;
  }
  format = (char *)(ulong)(uint)pPars->fSkipRedSupp;
  pAig_00 = Dch_DeriveChoiceAig(pAig,pPars->fSkipRedSupp);
  if (pPars->fVerbose != 0) {
    iVar4 = pAig->nObjs[6];
    iVar1 = pAig->nObjs[5];
    iVar2 = pAig_00->nObjs[6];
    iVar3 = pAig_00->nObjs[5];
    uVar5 = Dch_DeriveChoiceCountReprs(pAig);
    uVar6 = Dch_DeriveChoiceCountEquivs(pAig_00);
    pAVar12 = pAig_00;
    iVar7 = Aig_ManChoiceNum(pAig_00);
    Abc_Print((int)pAVar12,format,(ulong)(uint)(iVar4 + iVar1),(ulong)(uint)(iVar2 + iVar3),
              (ulong)uVar5,(ulong)uVar6,CONCAT44(uVar13,iVar7));
  }
  return pAig_00;
}

Assistant:

Aig_Man_t * Dch_ComputeChoices( Aig_Man_t * pAig, Dch_Pars_t * pPars )
{
    Dch_Man_t * p;
    Aig_Man_t * pResult;
    abctime clk, clkTotal = Abc_Clock();
    // reset random numbers
    Aig_ManRandom(1);
    // start the choicing manager
    p = Dch_ManCreate( pAig, pPars );
    // compute candidate equivalence classes
clk = Abc_Clock(); 
    p->ppClasses = Dch_CreateCandEquivClasses( pAig, pPars->nWords, pPars->fVerbose );
p->timeSimInit = Abc_Clock() - clk;
//    Dch_ClassesPrint( p->ppClasses, 0 );
    p->nLits = Dch_ClassesLitNum( p->ppClasses );
    // perform SAT sweeping
    Dch_ManSweep( p );
    // free memory ahead of time
p->timeTotal = Abc_Clock() - clkTotal;
    Dch_ManStop( p );
    // create choices
    ABC_FREE( pAig->pTable );
    pResult = Dch_DeriveChoiceAig( pAig, pPars->fSkipRedSupp );
    // count the number of representatives
    if ( pPars->fVerbose ) 
        Abc_Print( 1, "STATS:  Ands:%8d  ->%8d.  Reprs:%7d  ->%7d.  Choices =%7d.\n", 
               Aig_ManNodeNum(pAig), 
               Aig_ManNodeNum(pResult), 
               Dch_DeriveChoiceCountReprs( pAig ),
               Dch_DeriveChoiceCountEquivs( pResult ),
               Aig_ManChoiceNum( pResult ) );
    return pResult;
}